

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc32_hw1.c
# Opt level: O2

uint32_t crc32c(void *buf,size_t len,uint32_t crc)

{
  uint32_t uVar1;
  ulong uVar2;
  ulong uVar3;
  undefined8 *puVar4;
  ulong uVar5;
  ulong uVar6;
  void *pvVar7;
  undefined8 uVar8;
  
  pthread_once(&crc32c_once_hw,crc32c_init_hw);
  uVar6 = (ulong)~crc;
  for (pvVar7 = buf; (uVar3 = len, len != 0 && (((ulong)pvVar7 & 7) != 0));
      pvVar7 = (void *)((long)pvVar7 + 1)) {
    uVar6 = crc32(uVar6,*buf);
    buf = (void *)((long)buf + 1);
    len = len - 1;
  }
  for (; 0x5fff < uVar3; uVar3 = uVar3 - 0x6000) {
    uVar2 = 0xfffffffffffffff8;
    uVar8 = 0;
    uVar5 = 0;
    do {
      puVar4 = (undefined8 *)(uVar2 + 8 + (long)buf);
      uVar2 = uVar2 + 8;
      uVar6 = crc32(uVar6,*puVar4);
      uVar8 = crc32(uVar8,puVar4[0x400]);
      uVar5 = crc32(uVar5,puVar4[0x800]);
    } while (uVar2 < 0x1ff8);
    uVar1 = crc32c_shift(crc32c_long,(uint32_t)uVar6);
    uVar1 = crc32c_shift(crc32c_long,(uint)uVar8 ^ uVar1);
    uVar6 = uVar5 ^ uVar1;
    buf = (void *)((long)buf + 0x6000);
  }
  for (; 0x2ff < uVar3; uVar3 = uVar3 - 0x300) {
    uVar2 = 0xfffffffffffffff8;
    uVar8 = 0;
    uVar5 = 0;
    do {
      puVar4 = (undefined8 *)(uVar2 + 8 + (long)buf);
      uVar2 = uVar2 + 8;
      uVar6 = crc32(uVar6,*puVar4);
      uVar8 = crc32(uVar8,puVar4[0x20]);
      uVar5 = crc32(uVar5,puVar4[0x40]);
    } while (uVar2 < 0xf8);
    uVar1 = crc32c_shift(crc32c_short,(uint32_t)uVar6);
    uVar1 = crc32c_shift(crc32c_short,(uint)uVar8 ^ uVar1);
    uVar6 = uVar5 ^ uVar1;
    buf = (void *)((long)buf + 0x300);
  }
  puVar4 = (undefined8 *)((ulong)((uint)uVar3 & 0x3f8) + (long)buf);
  for (; buf < puVar4; buf = (void *)((long)buf + 8)) {
    uVar6 = crc32(uVar6,*buf);
  }
  for (uVar3 = 0; ((uint)len & 7) != uVar3; uVar3 = uVar3 + 1) {
    uVar6 = crc32(uVar6,*(undefined1 *)((long)buf + uVar3));
  }
  return ~(uint)uVar6;
}

Assistant:

uint32_t crc32c(const void *buf, size_t len, uint32_t crc)
{
    const unsigned char *next = buf;
    const unsigned char *end;
    uint64_t crc0, crc1, crc2;      /* need to be 64 bits for crc32q */

    /* populate shift tables the first time through */
    pthread_once(&crc32c_once_hw, crc32c_init_hw);

    /* pre-process the crc */
    crc0 = crc ^ 0xffffffff;

    /* compute the crc for up to seven leading bytes to bring the data pointer
       to an eight-byte boundary */
    while (len && ((uintptr_t)next & 7) != 0) {
        __asm__("crc32b\t" "(%1), %0"
                : "=r"(crc0)
                : "r"(next), "0"(crc0));
        next++;
        len--;
    }

    /* compute the crc on sets of LONG*3 bytes, executing three independent crc
       instructions, each on LONG bytes -- this is optimized for the Nehalem,
       Westmere, Sandy Bridge, and Ivy Bridge architectures, which have a
       throughput of one crc per cycle, but a latency of three cycles */
    while (len >= LONG*3) {
        crc1 = 0;
        crc2 = 0;
        end = next + LONG;
        do {
            __asm__("crc32q\t" "(%3), %0\n\t"
                    "crc32q\t" LONGx1 "(%3), %1\n\t"
                    "crc32q\t" LONGx2 "(%3), %2"
                    : "=r"(crc0), "=r"(crc1), "=r"(crc2)
                    : "r"(next), "0"(crc0), "1"(crc1), "2"(crc2));
            next += 8;
        } while (next < end);
        crc0 = crc32c_shift(crc32c_long, crc0) ^ crc1;
        crc0 = crc32c_shift(crc32c_long, crc0) ^ crc2;
        next += LONG*2;
        len -= LONG*3;
    }

    /* do the same thing, but now on SHORT*3 blocks for the remaining data less
       than a LONG*3 block */
    while (len >= SHORT*3) {
        crc1 = 0;
        crc2 = 0;
        end = next + SHORT;
        do {
            __asm__("crc32q\t" "(%3), %0\n\t"
                    "crc32q\t" SHORTx1 "(%3), %1\n\t"
                    "crc32q\t" SHORTx2 "(%3), %2"
                    : "=r"(crc0), "=r"(crc1), "=r"(crc2)
                    : "r"(next), "0"(crc0), "1"(crc1), "2"(crc2));
            next += 8;
        } while (next < end);
        crc0 = crc32c_shift(crc32c_short, crc0) ^ crc1;
        crc0 = crc32c_shift(crc32c_short, crc0) ^ crc2;
        next += SHORT*2;
        len -= SHORT*3;
    }

    /* compute the crc on the remaining eight-byte units less than a SHORT*3
       block */
    end = next + (len - (len & 7));
    while (next < end) {
        __asm__("crc32q\t" "(%1), %0"
                : "=r"(crc0)
                : "r"(next), "0"(crc0));
        next += 8;
    }
    len &= 7;

    /* compute the crc for up to seven trailing bytes */
    while (len) {
        __asm__("crc32b\t" "(%1), %0"
                : "=r"(crc0)
                : "r"(next), "0"(crc0));
        next++;
        len--;
    }

    /* return a post-processed crc */
    return (uint32_t)(crc0 ^ 0xffffffff);
}